

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O0

void __thiscall AInventory::BecomeItem(AInventory *this)

{
  uint uVar1;
  FState *newstate;
  FName local_24;
  Self local_20;
  Self local_1c;
  undefined1 local_18 [4];
  TFlags<ActorFlag,_unsigned_int> local_14;
  AInventory *local_10;
  AInventory *this_local;
  
  local_10 = this;
  ::operator|((EnumType)local_18,MF_NOBLOCKMAP);
  TFlags<ActorFlag,_unsigned_int>::operator&(&local_14,&(this->super_AActor).flags);
  uVar1 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_14);
  if (uVar1 == 0) {
    AActor::UnlinkFromWorld(&this->super_AActor);
    if (sector_list != (msecnode_t *)0x0) {
      P_DelSeclist(sector_list);
      sector_list = (msecnode_t *)0x0;
    }
    ::operator|((EnumType)&local_1c,MF_NOBLOCKMAP);
    TFlags<ActorFlag,_unsigned_int>::operator|=(&(this->super_AActor).flags,&local_1c);
    AActor::LinkToWorld(&this->super_AActor,false,(sector_t *)0x0);
  }
  AActor::RemoveFromHash(&this->super_AActor);
  operator~((EnumType)&local_20);
  TFlags<ActorFlag,_unsigned_int>::operator&=(&(this->super_AActor).flags,&local_20);
  DThinker::ChangeStatNum((DThinker *)this,0x25);
  FName::FName(&local_24,"Held");
  newstate = AActor::FindState(&this->super_AActor,&local_24);
  AActor::SetState(&this->super_AActor,newstate,false);
  return;
}

Assistant:

void AInventory::BecomeItem ()
{
	if (!(flags & (MF_NOBLOCKMAP|MF_NOSECTOR)))
	{
		UnlinkFromWorld ();
		if (sector_list)
		{
			P_DelSeclist (sector_list);
			sector_list = NULL;
		}
		flags |= MF_NOBLOCKMAP|MF_NOSECTOR;
		LinkToWorld ();
	}
	RemoveFromHash ();
	flags &= ~MF_SPECIAL;
	ChangeStatNum(STAT_INVENTORY);
	SetState (FindState("Held"));
}